

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall QPDFJob::doShowPages(QPDFJob *this,QPDF *pdf)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  reference this_00;
  Pipeline *pPVar6;
  reference str;
  string local_220;
  QPDFObjectHandle *local_200;
  QPDFObjectHandle *iter2_1;
  iterator __end2;
  iterator __begin2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range2;
  allocator<char> local_1a1;
  string local_1a0 [32];
  QPDFObjectHandle local_180;
  int local_170;
  allocator<char> local_169;
  int height;
  QPDFObjectHandle local_148;
  int local_134;
  undefined1 local_130 [4];
  int width;
  QPDFObjectHandle dict;
  QPDFObjectHandle image;
  string *name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *iter2;
  iterator __end4;
  iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  *__range4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  images;
  QPDFObjectHandle page;
  QPDFPageObjectHelper *ph;
  __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
  local_98;
  iterator __end1;
  iterator __begin1;
  QPDFPageDocumentHelper local_78;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_58;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_40;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  element_type *local_28;
  element_type *cout;
  QPDF *pQStack_18;
  int pageno;
  QPDF *pdf_local;
  QPDFJob *this_local;
  
  cout._4_4_ = 0;
  pQStack_18 = pdf;
  pdf_local = (QPDF *)this;
  peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar4 = std::__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar3);
  QPDFLogger::getInfo((QPDFLogger *)&__range1,SUB81(peVar4,0));
  peVar5 = std::__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                     ((__shared_ptr_access<Pipeline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &__range1);
  std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&__range1);
  local_28 = peVar5;
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_78,pQStack_18);
  QPDFPageDocumentHelper::getAllPages(&local_58,&local_78);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_78);
  local_40 = &local_58;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_40)
  ;
  local_98._M_current =
       (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_40);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_98), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
              ::operator*(&__end1);
    QPDFObjectHelper::getObjectHandle
              ((QPDFObjectHelper *)&images._M_t._M_impl.super__Rb_tree_header._M_node_count);
    cout._4_4_ = cout._4_4_ + 1;
    pPVar6 = Pipeline::operator<<(local_28,"page ");
    pPVar6 = Pipeline::operator<<(pPVar6,cout._4_4_);
    pPVar6 = Pipeline::operator<<(pPVar6,": ");
    iVar2 = QPDFObjectHandle::getObjectID
                      ((QPDFObjectHandle *)&images._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    pPVar6 = Pipeline::operator<<(pPVar6,iVar2);
    pPVar6 = Pipeline::operator<<(pPVar6," ");
    iVar2 = QPDFObjectHandle::getGeneration
                      ((QPDFObjectHandle *)&images._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    pPVar6 = Pipeline::operator<<(pPVar6,iVar2);
    Pipeline::operator<<(pPVar6," R\n");
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    if ((peVar3->show_page_images & 1U) != 0) {
      QPDFPageObjectHelper::getImages_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                  *)&__range4,this_00);
      bVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                       *)&__range4);
      if (!bVar1) {
        Pipeline::operator<<(local_28,"  images:\n");
        __end4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                 ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                          *)&__range4);
        iter2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                          *)&__range4);
        while (bVar1 = std::operator!=(&__end4,(_Self *)&iter2), bVar1) {
          str = std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                ::operator*(&__end4);
          QPDFObjectHandle::QPDFObjectHandle
                    ((QPDFObjectHandle *)
                     &dict.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &str->second);
          QPDFObjectHandle::getDict((QPDFObjectHandle *)local_130);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&height,"/Width",&local_169);
          QPDFObjectHandle::getKey(&local_148,(string *)local_130);
          iVar2 = QPDFObjectHandle::getIntValueAsInt(&local_148);
          QPDFObjectHandle::~QPDFObjectHandle(&local_148);
          std::__cxx11::string::~string((string *)&height);
          std::allocator<char>::~allocator(&local_169);
          local_134 = iVar2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_1a0,"/Height",&local_1a1);
          QPDFObjectHandle::getKey(&local_180,(string *)local_130);
          iVar2 = QPDFObjectHandle::getIntValueAsInt(&local_180);
          QPDFObjectHandle::~QPDFObjectHandle(&local_180);
          std::__cxx11::string::~string(local_1a0);
          std::allocator<char>::~allocator(&local_1a1);
          local_170 = iVar2;
          pPVar6 = Pipeline::operator<<(local_28,"    ");
          pPVar6 = Pipeline::operator<<(pPVar6,&str->first);
          pPVar6 = Pipeline::operator<<(pPVar6,": ");
          QPDFObjectHandle::unparse_abi_cxx11_
                    ((string *)&__range2,
                     (QPDFObjectHandle *)
                     &dict.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          pPVar6 = Pipeline::operator<<(pPVar6,(string *)&__range2);
          pPVar6 = Pipeline::operator<<(pPVar6,", ");
          pPVar6 = Pipeline::operator<<(pPVar6,local_134);
          pPVar6 = Pipeline::operator<<(pPVar6," x ");
          pPVar6 = Pipeline::operator<<(pPVar6,local_170);
          Pipeline::operator<<(pPVar6,"\n");
          std::__cxx11::string::~string((string *)&__range2);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_130);
          QPDFObjectHandle::~QPDFObjectHandle
                    ((QPDFObjectHandle *)
                     &dict.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
          ::operator++(&__end4);
        }
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
              *)&__range4);
    }
    Pipeline::operator<<(local_28,"  content:\n");
    QPDFPageObjectHelper::getPageContents
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2,this_00);
    __end2 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
    iter2_1 = (QPDFObjectHandle *)
              std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&iter2_1), bVar1) {
      local_200 = __gnu_cxx::
                  __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                  ::operator*(&__end2);
      pPVar6 = Pipeline::operator<<(local_28,"    ");
      QPDFObjectHandle::unparse_abi_cxx11_(&local_220,local_200);
      pPVar6 = Pipeline::operator<<(pPVar6,&local_220);
      Pipeline::operator<<(pPVar6,"\n");
      std::__cxx11::string::~string((string *)&local_220);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&__begin2);
    QPDFObjectHandle::~QPDFObjectHandle
              ((QPDFObjectHandle *)&images._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&local_58);
  return;
}

Assistant:

void
QPDFJob::doShowPages(QPDF& pdf)
{
    int pageno = 0;
    auto& cout = *m->log->getInfo();
    for (auto& ph: QPDFPageDocumentHelper(pdf).getAllPages()) {
        QPDFObjectHandle page = ph.getObjectHandle();
        ++pageno;

        cout << "page " << pageno << ": " << page.getObjectID() << " " << page.getGeneration()
             << " R\n";
        if (m->show_page_images) {
            std::map<std::string, QPDFObjectHandle> images = ph.getImages();
            if (!images.empty()) {
                cout << "  images:\n";
                for (auto const& iter2: images) {
                    std::string const& name = iter2.first;
                    QPDFObjectHandle image = iter2.second;
                    QPDFObjectHandle dict = image.getDict();
                    int width = dict.getKey("/Width").getIntValueAsInt();
                    int height = dict.getKey("/Height").getIntValueAsInt();
                    cout << "    " << name << ": " << image.unparse() << ", " << width << " x "
                         << height << "\n";
                }
            }
        }

        cout << "  content:\n";
        for (auto& iter2: ph.getPageContents()) {
            cout << "    " << iter2.unparse() << "\n";
        }
    }
}